

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::localError
          (CommonCore *this,LocalFederateId federateID,int errorCode,string_view errorString)

{
  FederateStates FVar1;
  MessageProcessingResult MVar2;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  string_view message;
  string_view errorString_local;
  ActionMessage error;
  
  errorString_local._M_str = errorString._M_str;
  errorString_local._M_len = errorString._M_len;
  this_00 = getFederateAt(this,federateID);
  if (this_00 == (FederateState *)0x0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message._M_str = "federateID not valid error";
    message._M_len = 0x1a;
    InvalidIdentifier::InvalidIdentifier(this_01,message);
    __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  ActionMessage::ActionMessage(&error,cmd_local_error);
  error.source_id.gid = (this_00->global_id)._M_i.gid;
  error.messageID = errorCode;
  SmallBuffer::operator=
            (&error.payload,(basic_string_view<char,_std::char_traits<char>_> *)&errorString_local);
  if (this_00->mCallbackBased == true) {
    error.flags._0_1_ = (byte)error.flags | 0x20;
  }
  BrokerBase::addActionMessage(&this->super_BrokerBase,&error);
  if (this_00->mCallbackBased == false) {
    FederateState::addAction(this_00,&error);
    MVar2 = NEXT_STEP;
    do {
      if (MVar2 == ERROR_RESULT) break;
      FVar1 = FederateState::getState(this_00);
      if (FVar1 == FINISHED) break;
      FVar1 = FederateState::getState(this_00);
      if (FVar1 == ERRORED) break;
      MVar2 = FederateState::genericUnspecifiedQueueProcess(this_00,false);
    } while ((10 < (byte)MVar2) || ((0x488U >> ((byte)MVar2 & 0x1f) & 1) == 0));
  }
  ActionMessage::~ActionMessage(&error);
  return;
}

Assistant:

void CommonCore::localError(LocalFederateId federateID, int errorCode, std::string_view errorString)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid error"));
    }
    ActionMessage error(CMD_LOCAL_ERROR);
    error.source_id = fed->global_id.load();
    error.messageID = errorCode;
    error.payload = errorString;
    if (fed->isCallbackFederate()) {
        setActionFlag(error, indicator_flag);
    }
    addActionMessage(error);
    if (fed->isCallbackFederate()) {
        return;
    }
    fed->addAction(error);
    MessageProcessingResult ret = MessageProcessingResult::NEXT_STEP;
    while (ret != MessageProcessingResult::ERROR_RESULT) {
        if (fed->getState() == FederateStates::FINISHED ||
            fed->getState() == FederateStates::ERRORED) {
            return;
        }
        ret = fed->genericUnspecifiedQueueProcess(false);
        switch (ret) {
            case MessageProcessingResult::ERROR_RESULT:
            case MessageProcessingResult::HALTED:
            case MessageProcessingResult::BUSY:
                return;
            default:
                break;
        }
    }
}